

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

string * testing::internal::StripTrailingSpaces(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this;
  reference pcVar2;
  long in_FS_OFFSET;
  bool local_59;
  string *str_local;
  undefined8 local_30;
  char *local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  iterator it;
  
  it._M_current = *(char **)(in_FS_OFFSET + 0x28);
  local_18._M_current = (char *)std::__cxx11::string::end();
  while( true ) {
    local_20._M_current = (char *)std::__cxx11::string::begin();
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    local_59 = false;
    if (bVar1) {
      this = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator--(&local_18);
      pcVar2 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(this);
      local_59 = IsSpace(*pcVar2);
    }
    if (local_59 == false) break;
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_18);
    local_28 = (char *)std::__cxx11::string::erase(str,local_30);
    local_18._M_current = local_28;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  if (*(char **)(in_FS_OFFSET + 0x28) != it._M_current) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string StripTrailingSpaces(std::string str) {
  std::string::iterator it = str.end();
  while (it != str.begin() && IsSpace(*--it))
    it = str.erase(it);
  return str;
}